

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void hash_table_clear(hash_table_t *table)

{
  uint uVar1;
  hash_table_bucket_t *phVar2;
  hash_table_bucket_t *phVar3;
  ulong uVar4;
  ulong uVar5;
  hash_table_bucket_t *phVar6;
  hash_table_bucket_t *phVar7;
  
  uVar1 = table->n_buckets;
  if ((ulong)uVar1 != 0) {
    phVar2 = table->buckets;
    uVar4 = 0;
    do {
      phVar3 = phVar2[uVar4].next;
      if (phVar3 != (hash_table_bucket_t *)0x0) {
        phVar7 = table->free_buckets;
        do {
          phVar6 = phVar3;
          phVar3 = phVar6->next;
          phVar6->next = phVar7;
          phVar6->data = (void *)0x0;
          phVar7 = phVar6;
        } while (phVar3 != (hash_table_bucket_t *)0x0);
        table->free_buckets = phVar6;
      }
      uVar5 = uVar4 + 1;
      phVar3 = phVar2 + uVar4;
      phVar3->data = (void *)0x0;
      phVar3->next = (hash_table_bucket_t *)0x0;
      uVar4 = uVar5;
    } while (uVar5 != uVar1);
  }
  table->n_items = 0;
  return;
}

Assistant:

void hash_table_clear( hash_table_t * table )
{
    unsigned i;
    /* return all blocks to the free list */
    for ( i = 0; i < table->n_buckets; ++i ) {
        hash_table_bucket_t *c, * b = table->buckets[i].next;
        while (b) {
           c = b->next;
           b->next = table->free_buckets;
           b->data = NULL;
           table->free_buckets = b;
           b = c; 
        }
        table->buckets[i].next = NULL;
        table->buckets[i].data = NULL;
    }
    table->n_items = 0;
}